

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O0

void __thiscall
S2CrossingEdgeQuery::GetCrossingEdges
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,S2Shape *shape,CrossingType type,
          vector<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_> *edges)

{
  bool bVar1;
  int iVar2;
  reference pSVar3;
  ShapeEdge local_188;
  undefined1 local_150 [8];
  Edge b;
  int edge_id;
  ShapeEdgeId candidate;
  iterator __end1;
  iterator __begin1;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *__range1;
  S2CopyingEdgeCrosser crosser;
  int min_sign;
  vector<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_> *edges_local;
  CrossingType type_local;
  S2Shape *shape_local;
  S2Point *a1_local;
  S2Point *a0_local;
  S2CrossingEdgeQuery *this_local;
  
  std::vector<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>::clear(edges);
  GetCandidates(this,a0,a1,shape,&this->tmp_candidates_);
  crosser.crosser_.bda_ = (int)(type != ALL);
  S2CopyingEdgeCrosser::S2CopyingEdgeCrosser((S2CopyingEdgeCrosser *)&__range1,a0,a1);
  __end1 = std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::begin
                     (&this->tmp_candidates_);
  candidate = (ShapeEdgeId)
              std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::end
                        (&this->tmp_candidates_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                                     *)&candidate), bVar1) {
    pSVar3 = __gnu_cxx::
             __normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
             ::operator*(&__end1);
    edge_id = (*pSVar3).edge_id;
    b.v1.c_[2]._4_4_ = edge_id;
    (*shape->_vptr_S2Shape[3])(local_150,shape,(ulong)(uint)edge_id);
    iVar2 = S2CopyingEdgeCrosser::CrossingSign
                      ((S2CopyingEdgeCrosser *)&__range1,(S2Point *)local_150,
                       (S2Point *)(b.v0.c_ + 2));
    if (crosser.crosser_.bda_ <= iVar2) {
      iVar2 = S2Shape::id(shape);
      s2shapeutil::ShapeEdge::ShapeEdge(&local_188,iVar2,b.v1.c_[2]._4_4_,(Edge *)local_150);
      std::vector<s2shapeutil::ShapeEdge,_std::allocator<s2shapeutil::ShapeEdge>_>::push_back
                (edges,&local_188);
    }
    __gnu_cxx::
    __normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void S2CrossingEdgeQuery::GetCrossingEdges(
    const S2Point& a0, const S2Point& a1, const S2Shape& shape,
    CrossingType type, vector<ShapeEdge>* edges) {
  edges->clear();
  GetCandidates(a0, a1, shape, &tmp_candidates_);
  int min_sign = (type == CrossingType::ALL) ? 0 : 1;
  S2CopyingEdgeCrosser crosser(a0, a1);
  for (ShapeEdgeId candidate : tmp_candidates_) {
    int edge_id = candidate.edge_id;
    S2Shape::Edge b = shape.edge(edge_id);
    if (crosser.CrossingSign(b.v0, b.v1) >= min_sign) {
      edges->push_back(ShapeEdge(shape.id(), edge_id, b));
    }
  }
}